

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.cpp
# Opt level: O0

void writeFile(string *file,string *content)

{
  string *in_RSI;
  undefined8 in_RDI;
  ofstream out;
  ostream local_210 [512];
  string *local_10;
  
  local_10 = in_RSI;
  std::ofstream::ofstream(local_210,in_RDI,0x10);
  std::operator<<(local_210,local_10);
  std::ostream::flush();
  std::ofstream::close();
  std::ofstream::~ofstream(local_210);
  return;
}

Assistant:

void writeFile(const std::string& file, const std::string& content)
{
    std::ofstream out(file);
    out << content;
    out.flush();
    out.close();
}